

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O2

string * __thiscall
loader::to_string_abi_cxx11_(string *__return_storage_ptr__,loader *this,ze_result_t result)

{
  int __val;
  char *pcVar1;
  allocator local_9;
  
  __val = (int)this;
  switch(__val) {
  case 0x78000001:
    pcVar1 = "ZE_RESULT_ERROR_UNINITIALIZED";
    break;
  case 0x78000002:
    pcVar1 = "ZE_RESULT_ERROR_UNSUPPORTED_VERSION";
    break;
  case 0x78000003:
    pcVar1 = "ZE_RESULT_ERROR_UNSUPPORTED_FEATURE";
    break;
  case 0x78000004:
    pcVar1 = "ZE_RESULT_ERROR_INVALID_ARGUMENT";
    break;
  case 0x78000005:
    pcVar1 = "ZE_RESULT_ERROR_INVALID_NULL_HANDLE";
    break;
  case 0x78000006:
    pcVar1 = "ZE_RESULT_ERROR_HANDLE_OBJECT_IN_USE";
    break;
  case 0x78000007:
    pcVar1 = "ZE_RESULT_ERROR_INVALID_NULL_POINTER";
    break;
  case 0x78000008:
    pcVar1 = "ZE_RESULT_ERROR_INVALID_SIZE";
    break;
  case 0x78000009:
    pcVar1 = "ZE_RESULT_ERROR_UNSUPPORTED_SIZE";
    break;
  case 0x7800000a:
    pcVar1 = "ZE_RESULT_ERROR_UNSUPPORTED_ALIGNMENT";
    break;
  case 0x7800000b:
    pcVar1 = "ZE_RESULT_ERROR_INVALID_SYNCHRONIZATION_OBJECT";
    break;
  case 0x7800000c:
    pcVar1 = "ZE_RESULT_ERROR_INVALID_ENUMERATION";
    break;
  case 0x7800000d:
    pcVar1 = "ZE_RESULT_ERROR_UNSUPPORTED_ENUMERATION";
    break;
  case 0x7800000e:
    pcVar1 = "ZE_RESULT_ERROR_UNSUPPORTED_IMAGE_FORMAT";
    break;
  case 0x7800000f:
    pcVar1 = "ZE_RESULT_ERROR_INVALID_NATIVE_BINARY";
    break;
  case 0x78000010:
    pcVar1 = "ZE_RESULT_ERROR_INVALID_GLOBAL_NAME";
    break;
  case 0x78000011:
    pcVar1 = "ZE_RESULT_ERROR_INVALID_KERNEL_NAME";
    break;
  case 0x78000012:
    pcVar1 = "ZE_RESULT_ERROR_INVALID_FUNCTION_NAME";
    break;
  case 0x78000013:
    pcVar1 = "ZE_RESULT_ERROR_INVALID_GROUP_SIZE_DIMENSION";
    break;
  case 0x78000014:
    pcVar1 = "ZE_RESULT_ERROR_INVALID_GLOBAL_WIDTH_DIMENSION";
    break;
  case 0x78000015:
    pcVar1 = "ZE_RESULT_ERROR_INVALID_KERNEL_ARGUMENT_INDEX";
    break;
  case 0x78000016:
    pcVar1 = "ZE_RESULT_ERROR_INVALID_KERNEL_ARGUMENT_SIZE";
    break;
  case 0x78000017:
    pcVar1 = "ZE_RESULT_ERROR_INVALID_KERNEL_ATTRIBUTE_VALUE";
    break;
  case 0x78000018:
    pcVar1 = "ZE_RESULT_ERROR_INVALID_MODULE_UNLINKED";
    break;
  case 0x78000019:
    pcVar1 = "ZE_RESULT_ERROR_INVALID_COMMAND_LIST_TYPE";
    break;
  case 0x7800001a:
    pcVar1 = "ZE_RESULT_ERROR_OVERLAPPING_REGIONS";
    break;
  default:
    switch(__val) {
    case 0x70000001:
      pcVar1 = "ZE_RESULT_ERROR_DEVICE_LOST";
      break;
    case 0x70000002:
      pcVar1 = "ZE_RESULT_ERROR_OUT_OF_HOST_MEMORY";
      break;
    case 0x70000003:
      pcVar1 = "ZE_RESULT_ERROR_OUT_OF_DEVICE_MEMORY";
      break;
    case 0x70000004:
      pcVar1 = "ZE_RESULT_ERROR_MODULE_BUILD_FAILURE";
      break;
    case 0x70000005:
      pcVar1 = "ZE_RESULT_ERROR_MODULE_LINK_FAILURE";
      break;
    default:
      if (__val == 0x7ffffffe) {
        pcVar1 = "ZE_RESULT_ERROR_UNKNOWN";
      }
      else if (__val == 1) {
        pcVar1 = "ZE_RESULT_NOT_READY";
      }
      else if (__val == 0x70010000) {
        pcVar1 = "ZE_RESULT_ERROR_INSUFFICIENT_PERMISSIONS";
      }
      else if (__val == 0x70010001) {
        pcVar1 = "ZE_RESULT_ERROR_NOT_AVAILABLE";
      }
      else if (__val == 0x70020000) {
        pcVar1 = "ZE_RESULT_ERROR_DEPENDENCY_UNAVAILABLE";
      }
      else if (__val == 0x70020001) {
        pcVar1 = "ZE_RESULT_WARNING_DROPPED_DATA";
      }
      else {
        if (__val != 0) {
          std::__cxx11::to_string(__return_storage_ptr__,__val);
          return __return_storage_ptr__;
        }
        pcVar1 = "ZE_RESULT_SUCCESS";
      }
    }
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,&local_9);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(const ze_result_t result) {
    if (result == ZE_RESULT_SUCCESS) {
        return "ZE_RESULT_SUCCESS";
    } else if (result == ZE_RESULT_NOT_READY) {
        return "ZE_RESULT_NOT_READY";
    } else if (result == ZE_RESULT_ERROR_UNINITIALIZED) {
        return "ZE_RESULT_ERROR_UNINITIALIZED";
    } else if (result == ZE_RESULT_ERROR_DEVICE_LOST) {
        return "ZE_RESULT_ERROR_DEVICE_LOST";
    } else if (result == ZE_RESULT_ERROR_INVALID_ARGUMENT) {
        return "ZE_RESULT_ERROR_INVALID_ARGUMENT";
    } else if (result == ZE_RESULT_ERROR_OUT_OF_HOST_MEMORY) {
        return "ZE_RESULT_ERROR_OUT_OF_HOST_MEMORY";
    } else if (result == ZE_RESULT_ERROR_OUT_OF_DEVICE_MEMORY) {
        return "ZE_RESULT_ERROR_OUT_OF_DEVICE_MEMORY";
    } else if (result == ZE_RESULT_ERROR_MODULE_BUILD_FAILURE) {
        return "ZE_RESULT_ERROR_MODULE_BUILD_FAILURE";
    } else if (result == ZE_RESULT_ERROR_MODULE_LINK_FAILURE) {
        return "ZE_RESULT_ERROR_MODULE_LINK_FAILURE";
    } else if (result == ZE_RESULT_ERROR_INSUFFICIENT_PERMISSIONS) {
        return "ZE_RESULT_ERROR_INSUFFICIENT_PERMISSIONS";
    } else if (result == ZE_RESULT_ERROR_NOT_AVAILABLE) {
        return "ZE_RESULT_ERROR_NOT_AVAILABLE";
    } else if (result == ZE_RESULT_ERROR_DEPENDENCY_UNAVAILABLE) {
        return "ZE_RESULT_ERROR_DEPENDENCY_UNAVAILABLE";
    } else if (result == ZE_RESULT_WARNING_DROPPED_DATA) {
        return "ZE_RESULT_WARNING_DROPPED_DATA";
    } else if (result == ZE_RESULT_ERROR_UNSUPPORTED_VERSION) {
        return "ZE_RESULT_ERROR_UNSUPPORTED_VERSION";
    } else if (result == ZE_RESULT_ERROR_UNSUPPORTED_FEATURE) {
        return "ZE_RESULT_ERROR_UNSUPPORTED_FEATURE";
    } else if (result == ZE_RESULT_ERROR_INVALID_NULL_HANDLE) {
        return "ZE_RESULT_ERROR_INVALID_NULL_HANDLE";
    } else if (result == ZE_RESULT_ERROR_HANDLE_OBJECT_IN_USE) {
        return "ZE_RESULT_ERROR_HANDLE_OBJECT_IN_USE";
    } else if (result == ZE_RESULT_ERROR_INVALID_NULL_POINTER) {
        return "ZE_RESULT_ERROR_INVALID_NULL_POINTER";
    } else if (result == ZE_RESULT_ERROR_INVALID_SIZE) {
        return "ZE_RESULT_ERROR_INVALID_SIZE";
    } else if (result == ZE_RESULT_ERROR_UNSUPPORTED_SIZE) {
        return "ZE_RESULT_ERROR_UNSUPPORTED_SIZE";
    } else if (result == ZE_RESULT_ERROR_UNSUPPORTED_ALIGNMENT) {
        return "ZE_RESULT_ERROR_UNSUPPORTED_ALIGNMENT";
    } else if (result == ZE_RESULT_ERROR_INVALID_SYNCHRONIZATION_OBJECT) {
        return "ZE_RESULT_ERROR_INVALID_SYNCHRONIZATION_OBJECT";
    } else if (result == ZE_RESULT_ERROR_INVALID_ENUMERATION) {
        return "ZE_RESULT_ERROR_INVALID_ENUMERATION";
    } else if (result == ZE_RESULT_ERROR_UNSUPPORTED_ENUMERATION) {
        return "ZE_RESULT_ERROR_UNSUPPORTED_ENUMERATION";
    } else if (result == ZE_RESULT_ERROR_UNSUPPORTED_IMAGE_FORMAT) {
        return "ZE_RESULT_ERROR_UNSUPPORTED_IMAGE_FORMAT";
    } else if (result == ZE_RESULT_ERROR_INVALID_NATIVE_BINARY) {
        return "ZE_RESULT_ERROR_INVALID_NATIVE_BINARY";
    } else if (result == ZE_RESULT_ERROR_INVALID_GLOBAL_NAME) {
        return "ZE_RESULT_ERROR_INVALID_GLOBAL_NAME";
    } else if (result == ZE_RESULT_ERROR_INVALID_KERNEL_NAME) {
        return "ZE_RESULT_ERROR_INVALID_KERNEL_NAME";
    } else if (result == ZE_RESULT_ERROR_INVALID_FUNCTION_NAME) {
        return "ZE_RESULT_ERROR_INVALID_FUNCTION_NAME";
    } else if (result == ZE_RESULT_ERROR_INVALID_GROUP_SIZE_DIMENSION) {
        return "ZE_RESULT_ERROR_INVALID_GROUP_SIZE_DIMENSION";
    } else if (result == ZE_RESULT_ERROR_INVALID_GLOBAL_WIDTH_DIMENSION) {
        return "ZE_RESULT_ERROR_INVALID_GLOBAL_WIDTH_DIMENSION";
    } else if (result == ZE_RESULT_ERROR_INVALID_KERNEL_ARGUMENT_INDEX) {
        return "ZE_RESULT_ERROR_INVALID_KERNEL_ARGUMENT_INDEX";
    } else if (result == ZE_RESULT_ERROR_INVALID_KERNEL_ARGUMENT_SIZE) {
        return "ZE_RESULT_ERROR_INVALID_KERNEL_ARGUMENT_SIZE";
    } else if (result == ZE_RESULT_ERROR_INVALID_KERNEL_ATTRIBUTE_VALUE) {
        return "ZE_RESULT_ERROR_INVALID_KERNEL_ATTRIBUTE_VALUE";
    } else if (result == ZE_RESULT_ERROR_INVALID_MODULE_UNLINKED) {
        return "ZE_RESULT_ERROR_INVALID_MODULE_UNLINKED";
    } else if (result == ZE_RESULT_ERROR_INVALID_COMMAND_LIST_TYPE) {
        return "ZE_RESULT_ERROR_INVALID_COMMAND_LIST_TYPE";
    } else if (result == ZE_RESULT_ERROR_OVERLAPPING_REGIONS) {
        return "ZE_RESULT_ERROR_OVERLAPPING_REGIONS";
    } else if (result == ZE_RESULT_ERROR_UNKNOWN) {
        return "ZE_RESULT_ERROR_UNKNOWN";
    } else {
        return std::to_string(static_cast<int>(result));
    }
}